

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

double interpolate_linear_sorted_ascending(double *x,double *y,int N,double z)

{
  int iVar1;
  double yhi;
  double ylo;
  int local_38;
  int k;
  int j;
  int i;
  double z_local;
  int N_local;
  double *y_local;
  double *x_local;
  
  k = 0;
  x_local = (double *)*y;
  if ((*x <= z) &&
     (local_38 = N + -1, iVar1 = k, x_local = (double *)y[N + -1], z < x[N + -1] || z == x[N + -1]))
  {
    while (k = iVar1, k < local_38 + -1) {
      iVar1 = (k + local_38) / 2;
      if (z < x[iVar1]) {
        local_38 = iVar1;
        iVar1 = k;
      }
    }
    if ((z != x[local_38]) || (NAN(z) || NAN(x[local_38]))) {
      if ((z != x[k]) || (NAN(z) || NAN(x[k]))) {
        x_local = (double *)((y[local_38] - y[k]) * ((z - x[k]) / (x[local_38] - x[k])) + y[k]);
      }
      else {
        x_local = (double *)y[k];
      }
    }
    else {
      x_local = (double *)y[local_38];
    }
  }
  return (double)x_local;
}

Assistant:

static double interpolate_linear_sorted_ascending(double *x,double *y, int N, double z) {
	/*
		Input x should be sorted in ascending order with all unique values for x. 
		Input y should have the index ordered on sorted x values.
	*/
	int i,j,k;
	double ylo,yhi;

	i = 0;
	j = N - 1;

	ylo= y[0];
	yhi = y[N-1];

	if (z < x[0]) {
		return ylo;
	}

	if (z > x[j]) {
		return yhi;
	}

	while (i < j-1) {
		k = (i + j)/2;
		if (z < x[k]) {
			j = k;
		} else {
			i = k;
		}
	}

	if (z == x[j]) {
		return y[j];
	}

	if (z == x[i]) {
		return y[i];
	}

	return y[i] + (y[j] - y[i])* ((z - x[i])/(x[j] - x[i]));
}